

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

size_t __thiscall
google::protobuf::hash<google::protobuf::MapKey>::operator()
          (hash<google::protobuf::MapKey> *this,MapKey *map_key)

{
  bool x;
  CppType CVar1;
  int32 __val;
  uint32 __val_00;
  int64 __val_01;
  uint64 __val_02;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  LogMessage *in_stack_ffffffffffffff30;
  LogMessage *this_00;
  undefined8 in_stack_ffffffffffffff38;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff90;
  hash<bool> local_63;
  hash<unsigned_int> local_62;
  hash<unsigned_long> local_61;
  hash<int> local_60;
  hash<long> local_5f [31];
  MapKey *in_stack_ffffffffffffffc0;
  size_t local_8;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  CVar1 = MapKey::type((MapKey *)in_stack_ffffffffffffff90);
  switch(CVar1) {
  case CPPTYPE_INT32:
    __val = MapKey::GetInt32Value(in_stack_ffffffffffffffc0);
    local_8 = std::hash<int>::operator()(&local_60,__val);
    break;
  case CPPTYPE_INT64:
    __val_01 = MapKey::GetInt64Value(in_stack_ffffffffffffffc0);
    local_8 = std::hash<long>::operator()(local_5f,__val_01);
    break;
  case CPPTYPE_UINT32:
    __val_00 = MapKey::GetUInt32Value(in_stack_ffffffffffffffc0);
    local_8 = std::hash<unsigned_int>::operator()(&local_62,__val_00);
    break;
  case CPPTYPE_UINT64:
    __val_02 = MapKey::GetUInt64Value(in_stack_ffffffffffffffc0);
    local_8 = std::hash<unsigned_long>::operator()(&local_61,__val_02);
    break;
  case CPPTYPE_DOUBLE:
  case CPPTYPE_FLOAT:
  case CPPTYPE_ENUM:
  case CPPTYPE_MESSAGE:
    in_stack_ffffffffffffff40 = (LogMessage *)(local_5f + 0xf);
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff40,level,(char *)in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff2c);
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff30,
               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_ffffffffffffff30,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    internal::LogMessage::~LogMessage((LogMessage *)0x43d0e4);
  default:
    this_00 = (LogMessage *)&stack0xffffffffffffff60;
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff40,level,(char *)this_00,in_stack_ffffffffffffff2c);
    internal::LogMessage::operator<<
              (this_00,(char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    internal::LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    internal::LogMessage::~LogMessage((LogMessage *)0x43d247);
    local_8 = 0;
    break;
  case CPPTYPE_BOOL:
    x = MapKey::GetBoolValue(in_stack_ffffffffffffffc0);
    local_8 = hash<bool>::operator()(&local_63,x);
    break;
  case CPPTYPE_STRING:
    MapKey::GetStringValue_abi_cxx11_(in_stack_ffffffffffffffc0);
    local_8 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffff30,
                           (string *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  }
  return local_8;
}

Assistant:

size_t operator()(const ::PROTOBUF_NAMESPACE_ID::MapKey& map_key) const {
    switch (map_key.type()) {
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_DOUBLE:
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_FLOAT:
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_ENUM:
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Unsupported";
        break;
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_STRING:
        return hash<std::string>()(map_key.GetStringValue());
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_INT64:
        return hash<int64>()(map_key.GetInt64Value());
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_INT32:
        return hash<int32>()(map_key.GetInt32Value());
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_UINT64:
        return hash<uint64>()(map_key.GetUInt64Value());
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_UINT32:
        return hash<uint32>()(map_key.GetUInt32Value());
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_BOOL:
        return hash<bool>()(map_key.GetBoolValue());
    }
    GOOGLE_LOG(FATAL) << "Can't get here.";
    return 0;
  }